

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

EbmlElement * __thiscall
libebml::EbmlMaster::FindFirstElt(EbmlMaster *this,EbmlCallbacks *Callbacks)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference ppEVar5;
  undefined4 extraout_var;
  EbmlId local_38;
  ulong local_28;
  size_t Index;
  EbmlCallbacks *Callbacks_local;
  EbmlMaster *this_local;
  
  local_28 = 0;
  Index = (size_t)Callbacks;
  Callbacks_local = (EbmlCallbacks *)this;
  while( true ) {
    uVar1 = local_28;
    sVar4 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                      (&this->ElementList);
    if (sVar4 <= uVar1) {
      return (EbmlElement *)0x0;
    }
    ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
              operator[](&this->ElementList,local_28);
    iVar3 = (*(*ppEVar5)->_vptr_EbmlElement[3])();
    local_38._0_8_ = *(undefined8 *)CONCAT44(extraout_var,iVar3);
    local_38.Length = ((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
    bVar2 = EbmlId::operator==(&local_38,*(EbmlId **)(Index + 8));
    if (bVar2) break;
    local_28 = local_28 + 1;
  }
  ppEVar5 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::operator[]
                      (&this->ElementList,local_28);
  return *ppEVar5;
}

Assistant:

EbmlElement *EbmlMaster::FindFirstElt(const EbmlCallbacks & Callbacks) const
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if (EbmlId(*(ElementList[Index])) == EBML_INFO_ID(Callbacks))
      return ElementList[Index];
  }

  return NULL;
}